

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O0

void __thiscall NULLC::TraceContext::TraceContext(TraceContext *this)

{
  TraceContext *this_local;
  
  OutputContext::OutputContext(&this->output);
  TraceArray<NULLC::TraceScopeToken>::TraceArray(&this->scopeTokens,0x400);
  TraceArray<char>::TraceArray(&this->labels,0x2000);
  TraceArray<NULLC::TraceEvent>::TraceArray(&this->events,0x2000);
  TraceArray<char>::TraceArray(&this->outputBuf,0);
  TraceArray<char>::TraceArray(&this->tempBuf,0);
  this->outputEnabled = false;
  this->needComma = false;
  this->openEvent = false;
  this->depth = 0;
  this->outputDepth = 0;
  return;
}

Assistant:

TraceContext(): scopeTokens(1024), labels(8192), events(8192), outputBuf(0), tempBuf(0)
		{
			outputEnabled = false;

			needComma = false;
			openEvent = false;
			depth = 0;
			outputDepth = 0;
		}